

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

void R_InitTextureMapping(void)

{
  double dVar1;
  double dVar2;
  double local_20;
  double slope;
  double slopestep;
  int i;
  
  FocalLengthX = CenterX / FocalTangent;
  FocalLengthY = FocalLengthX * YaspectMul;
  dVar1 = TAngle<double>::Radians(&FieldOfView);
  dVar1 = tan(dVar1 / 2.0);
  viewingrangerecip = FloatToFixed(1.0 / dVar1);
  dVar1 = FocalTangent / (double)centerx;
  local_20 = 0.0;
  for (slopestep._4_4_ = centerx; slopestep._4_4_ <= viewwidth;
      slopestep._4_4_ = slopestep._4_4_ + 1) {
    dVar2 = atan(local_20);
    xtoviewangle[slopestep._4_4_] = (angle_t)(long)((6.283185307179586 - dVar2) * 683565275.5764316)
    ;
    local_20 = dVar1 + local_20;
  }
  for (slopestep._4_4_ = 0; slopestep._4_4_ < centerx; slopestep._4_4_ = slopestep._4_4_ + 1) {
    xtoviewangle[slopestep._4_4_] = -xtoviewangle[(viewwidth - slopestep._4_4_) + -1];
  }
  return;
}

Assistant:

void R_InitTextureMapping ()
{
	int i;

	// Calc focallength so FieldOfView angles cover viewwidth.
	FocalLengthX = CenterX / FocalTangent;
	FocalLengthY = FocalLengthX * YaspectMul;

	// This is 1/FocalTangent before the widescreen extension of FOV.
	viewingrangerecip = FLOAT2FIXED(1. / tan(FieldOfView.Radians() / 2));


	// Now generate xtoviewangle for sky texture mapping.
	// [RH] Do not generate viewangletox, because texture mapping is no
	// longer done with trig, so it's not needed.
	const double slopestep = FocalTangent / centerx;
	double slope;

	for (i = centerx, slope = 0; i <= viewwidth; i++, slope += slopestep)
	{
		xtoviewangle[i] = angle_t((2 * M_PI - atan(slope)) * (ANGLE_180 / M_PI));
	}
	for (i = 0; i < centerx; i++)
	{
		xtoviewangle[i] = 0 - xtoviewangle[viewwidth - i - 1];
	}
}